

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryControllersLoader15.cpp
# Opt level: O2

void __thiscall
COLLADASaxFWL::LibraryControllersLoader15::begin__Name_array(LibraryControllersLoader15 *this)

{
  Name_array__AttributeData *in_RSI;
  
  begin__Name_array((LibraryControllersLoader15 *)&this[-1].super_SourceArrayLoader15.mLoader,in_RSI
                   );
  return;
}

Assistant:

bool LibraryControllersLoader15::begin__Name_array( const COLLADASaxFWL15::Name_array__AttributeData& attributeData )
{
SaxVirtualFunctionTest15(begin__Name_array(attributeData));
COLLADASaxFWL::Name_array__AttributeData attrData;
attrData.present_attributes = 0;
attrData.id = attributeData.id;
attrData.name = attributeData.name;
if ( (attributeData.present_attributes & COLLADASaxFWL15::Name_array__AttributeData::ATTRIBUTE_COUNT_PRESENT) == COLLADASaxFWL15::Name_array__AttributeData::ATTRIBUTE_COUNT_PRESENT ) {
    attrData.count = attributeData.count;
    attrData.present_attributes |= COLLADASaxFWL::Name_array__AttributeData::ATTRIBUTE_COUNT_PRESENT;
}
return mLoader->begin__Name_array(attrData);
}